

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

int addUpvalue(Compiler *compiler,uint8_t index,_Bool isLocal)

{
  ObjFunction *pOVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pOVar1 = compiler->function;
  uVar2 = pOVar1->upvalueCount;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      if (uVar2 == 0x100) {
        error("Too many closure variables in function.");
        uVar2 = 0;
      }
      else {
        compiler->upvalues[(int)uVar2].isLocal = isLocal;
        compiler->upvalues[(int)uVar2].index = index;
        pOVar1->upvalueCount = uVar2 + 1;
      }
      return uVar2;
    }
    if ((compiler->upvalues[uVar3].index == index) && (compiler->upvalues[uVar3].isLocal == isLocal)
       ) break;
    uVar3 = uVar3 + 1;
  }
  return (int)uVar3;
}

Assistant:

static int addUpvalue(Compiler* compiler, uint8_t index, bool isLocal) {
    /**
     * before we add a new upvalue,
     * we first check to see if the function already has an upvalue that closes over that variable:
     */
    int upvalueCount = compiler->function->upvalueCount;
    for (int i = 0; i < upvalueCount; i++) {
        Upvalue* upvalue = &compiler->upvalues[i];
        if (upvalue->index == index && upvalue->isLocal == isLocal) {
            return i;
        }
    }

    //ensure the compiler doesn’t overflow that limit:
    if (upvalueCount == UINT8_COUNT) {
        error("Too many closure variables in function.");
        return 0;
    }

    // if be functions hasn't the upvalue create new one
    compiler->upvalues[upvalueCount].isLocal = isLocal;
    compiler->upvalues[upvalueCount].index = index;
    return compiler->function->upvalueCount++;
}